

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O3

void Bitmap_Operation::flipData(Image *image)

{
  uint uVar1;
  uint uVar2;
  uchar *__src;
  uint uVar3;
  ulong __n;
  uchar *__src_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> temp;
  allocator_type local_41;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  if ((image->_data != (uchar *)0x0) && (uVar1 = image->_height, 1 < uVar1)) {
    uVar2 = image->_rowSize;
    __n = (ulong)uVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_40,__n,&local_41);
    __src_00 = image->_data;
    uVar3 = uVar1 >> 1;
    __src = __src_00 + (uVar1 - 1) * uVar2;
    do {
      memcpy(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,__src_00,__n);
      memcpy(__src_00,__src,__n);
      memcpy(__src,local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,__n);
      __src_00 = __src_00 + __n;
      __src = __src + -__n;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

bool empty() const
        {
            return _data == nullptr;
        }